

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict2pid.c
# Opt level: O1

int dict2pid_free(dict2pid_t *d2p)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  if (d2p != (dict2pid_t *)0x0) {
    iVar1 = d2p->refcount;
    iVar2 = iVar1 + -1;
    d2p->refcount = iVar2;
    if (iVar1 < 2) {
      if (d2p->ldiph_lc != (s3ssid_t ***)0x0) {
        ckd_free_3d(d2p->ldiph_lc);
      }
      if (d2p->lrdiph_rc != (s3ssid_t ***)0x0) {
        ckd_free_3d(d2p->lrdiph_rc);
      }
      if (d2p->rssid != (xwdssid_t **)0x0) {
        free_compress_map(d2p->rssid,d2p->mdef->n_ciphone);
      }
      if (d2p->lrssid != (xwdssid_t **)0x0) {
        free_compress_map(d2p->lrssid,d2p->mdef->n_ciphone);
      }
      bin_mdef_free(d2p->mdef);
      dict_free(d2p->dict);
      ckd_free(d2p);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
dict2pid_free(dict2pid_t * d2p)
{
    if (d2p == NULL)
        return 0;
    if (--d2p->refcount > 0)
        return d2p->refcount;

    if (d2p->ldiph_lc)
        ckd_free_3d((void ***) d2p->ldiph_lc);

    if (d2p->lrdiph_rc)
        ckd_free_3d((void ***) d2p->lrdiph_rc);

    if (d2p->rssid)
        free_compress_map(d2p->rssid, bin_mdef_n_ciphone(d2p->mdef));

    if (d2p->lrssid)
        free_compress_map(d2p->lrssid, bin_mdef_n_ciphone(d2p->mdef));

    bin_mdef_free(d2p->mdef);
    dict_free(d2p->dict);
    ckd_free(d2p);
    return 0;
}